

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmidiin.cpp
# Opt level: O2

void mycallback(double deltatime,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *param_3)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  byte *pbVar4;
  size_type __n;
  int local_38;
  
  lVar1 = *(long *)(message + 8);
  lVar2 = *(long *)message;
  for (__n = 0; (lVar1 - lVar2 & 0xffffffffU) != __n; __n = __n + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Byte ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," = ");
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(message,__n);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*pbVar4);
    std::operator<<(poVar3,", ");
  }
  local_38 = (int)(lVar1 - lVar2);
  if (local_38 != 0) {
    std::operator<<((ostream *)&std::cout,"stamp = ");
    poVar3 = std::ostream::_M_insert<double>(deltatime);
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  return;
}

Assistant:

void mycallback( double deltatime, std::vector< unsigned char > *message, void */*userData*/ )
{
  unsigned int nBytes = message->size();
  for ( unsigned int i=0; i<nBytes; i++ )
    std::cout << "Byte " << i << " = " << (int)message->at(i) << ", ";
  if ( nBytes > 0 )
    std::cout << "stamp = " << deltatime << std::endl;
}